

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Stress::anon_unknown_0::VertexAttributeCase::iterate(VertexAttributeCase *this)

{
  ostringstream *this_00;
  RenderContext *context;
  short sVar1;
  bool bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  deUint32 dVar5;
  void *__s;
  void *__s_00;
  void *__s_01;
  long lVar6;
  short *psVar7;
  undefined4 extraout_var;
  short sVar8;
  long lVar9;
  int x;
  long lVar10;
  char *description;
  qpTestResult testResult;
  short *psVar11;
  short sVar12;
  short sVar13;
  int iVar14;
  long lVar15;
  value_type_conflict3 *__val;
  float posX;
  float fVar16;
  Surface resultImage;
  Surface local_1d0;
  TextureFormat local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  __s = operator_new(0x1e40);
  memset(__s,0,0x1e40);
  __s_00 = operator_new(0x1e40);
  memset(__s_00,0,0x1e40);
  __s_01 = operator_new(0x14ac);
  memset(__s_01,0,0x14ac);
  tcu::Surface::Surface(&local_1d0,0x100,0x100);
  lVar6 = (long)__s + 8;
  lVar9 = (long)__s_00 + 0xc;
  lVar10 = 0;
  do {
    fVar16 = (float)(int)lVar10 / 21.0;
    uVar3 = (&Stress::(anonymous_namespace)::s_specialFloats)[lVar10];
    iVar14 = 0;
    lVar15 = 0;
    do {
      *(float *)(lVar6 + -8 + lVar15 * 4) = fVar16 + fVar16 + -1.0;
      *(float *)(lVar6 + -4 + lVar15 * 4) = (float)iVar14 / 21.0 + (float)iVar14 / 21.0 + -1.0;
      *(undefined8 *)(lVar6 + lVar15 * 4) = 0x3f80000000000000;
      uVar4 = *(undefined4 *)((long)&Stress::(anonymous_namespace)::s_specialFloats + lVar15);
      *(undefined4 *)(lVar9 + -0xc + lVar15 * 4) = uVar3;
      *(undefined4 *)(lVar9 + -8 + lVar15 * 4) = uVar4;
      *(undefined8 *)(lVar9 + -4 + lVar15 * 4) = 0x3f8000003f800000;
      lVar15 = lVar15 + 4;
      iVar14 = iVar14 + 1;
    } while (lVar15 != 0x58);
    lVar10 = lVar10 + 1;
    lVar6 = lVar6 + 0x160;
    lVar9 = lVar9 + 0x160;
  } while (lVar10 != 0x16);
  psVar7 = (short *)((long)__s_01 + 10);
  sVar8 = 0;
  lVar6 = 0;
  do {
    lVar9 = -0x15;
    psVar11 = psVar7;
    do {
      sVar1 = (short)lVar9;
      sVar12 = sVar8 + sVar1 + 0x15;
      psVar11[-5] = sVar12;
      sVar13 = sVar8 + 0x2c + sVar1;
      psVar11[-4] = sVar13;
      psVar11[-3] = sVar8 + 0x2b + sVar1;
      psVar11[-2] = sVar12;
      psVar11[-1] = sVar13;
      *psVar11 = sVar8 + sVar1 + 0x16;
      psVar11 = psVar11 + 6;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0);
    lVar6 = lVar6 + 1;
    sVar8 = sVar8 + 0x16;
    psVar7 = psVar7 + 0x7e;
  } while (lVar6 != 0x15);
  local_1b0._0_8_ =
       ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Drawing a grid with the shader. Setting a_attr for each vertex to (special, special, 1, 1)."
             ,0x5b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  iVar14 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
             [3])();
  lVar6 = CONCAT44(extraout_var,iVar14);
  uVar3 = (**(code **)(lVar6 + 0x780))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"a_pos");
  uVar4 = (**(code **)(lVar6 + 0x780))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"a_attr");
  if (*(int *)&(this->super_RenderCase).field_0x84 == 0) {
    (**(code **)(lVar6 + 0x40))(0x8892,this->m_positionVboID);
    (**(code **)(lVar6 + 0x150))(0x8892,0x1e40,__s,0x88e4);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"VertexAttributeCase::iterate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                    ,0x288);
    (**(code **)(lVar6 + 0x40))(0x8892,this->m_attribVboID);
    (**(code **)(lVar6 + 0x150))(0x8892,0x1e40,__s_00,0x88e4);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"VertexAttributeCase::iterate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                    ,0x28c);
    (**(code **)(lVar6 + 0x40))(0x8893,this->m_elementVboID);
    (**(code **)(lVar6 + 0x150))(0x8893,0x14ac,__s_01,0x88e4);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"VertexAttributeCase::iterate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                    ,0x290);
  }
  (**(code **)(lVar6 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar6 + 0x188))(0x4000);
  (**(code **)(lVar6 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar6 + 0x1680))((((this->super_RenderCase).m_program)->m_program).m_program);
  iVar14 = *(int *)&(this->super_RenderCase).field_0x84;
  if (iVar14 == 1) {
    (**(code **)(lVar6 + 0x19f0))(uVar3,4,0x1406,0,0,__s);
    (**(code **)(lVar6 + 0x19f0))(uVar4,4,0x1406,0,0,__s_00);
    (**(code **)(lVar6 + 0x610))(uVar3);
    (**(code **)(lVar6 + 0x610))(uVar4);
    (**(code **)(lVar6 + 0x568))(4,0xa56,0x1403,__s_01);
    (**(code **)(lVar6 + 0x518))(uVar3);
    (**(code **)(lVar6 + 0x518))(uVar4);
  }
  else if (iVar14 == 0) {
    (**(code **)(lVar6 + 0x40))(0x8892,this->m_positionVboID);
    (**(code **)(lVar6 + 0x19f0))(uVar3,4,0x1406,0,0,0);
    (**(code **)(lVar6 + 0x40))(0x8892,this->m_attribVboID);
    (**(code **)(lVar6 + 0x19f0))(uVar4,4,0x1406,0,0,0);
    (**(code **)(lVar6 + 0x610))(uVar3);
    (**(code **)(lVar6 + 0x610))(uVar4);
    (**(code **)(lVar6 + 0x568))(4,0xa56,0x1403,0);
    (**(code **)(lVar6 + 0x518))(uVar3);
    (**(code **)(lVar6 + 0x518))(uVar4);
    (**(code **)(lVar6 + 0x40))(0x8892,0);
    (**(code **)(lVar6 + 0x40))(0x8893,0);
  }
  (**(code **)(lVar6 + 0x1680))(0);
  (**(code **)(lVar6 + 0x648))();
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"VertexAttributeCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x2b9);
  context = ((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx;
  local_1b8.order = RGBA;
  local_1b8.type = UNORM_INT8;
  if ((void *)local_1d0.m_pixels.m_cap != (void *)0x0) {
    local_1d0.m_pixels.m_cap = (size_t)local_1d0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,&local_1b8,local_1d0.m_width,local_1d0.m_height,1,
             (void *)local_1d0.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  bVar2 = RenderCase::checkResultImage(&this->super_RenderCase,&local_1d0);
  if (bVar2) {
    bVar2 = RenderCase::drawTestPattern(&this->super_RenderCase,false);
    testResult = (qpTestResult)!bVar2;
    description = "test pattern failed";
    if (bVar2) {
      description = "Pass";
    }
  }
  else {
    description = "missing or invalid fragments";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult
            ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             testResult,description);
  tcu::Surface::~Surface(&local_1d0);
  operator_delete(__s_01,0x14ac);
  operator_delete(__s_00,0x1e40);
  operator_delete(__s,0x1e40);
  return STOP;
}

Assistant:

VertexAttributeCase::IterateResult VertexAttributeCase::iterate (void)
{
	// Create a [s_specialFloats] X [s_specialFloats] grid of vertices with each vertex having 2 [s_specialFloats] values
	// and calculate some basic operations with the floating point values. If all goes well, nothing special should happen

	std::vector<tcu::Vec4>	gridVertices	(DE_LENGTH_OF_ARRAY(s_specialFloats) * DE_LENGTH_OF_ARRAY(s_specialFloats));
	std::vector<tcu::UVec4>	gridAttributes	(DE_LENGTH_OF_ARRAY(s_specialFloats) * DE_LENGTH_OF_ARRAY(s_specialFloats));
	std::vector<deUint16>	indices			((DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) * 6);
	tcu::Surface			resultImage		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
	{
		const deUint32	one		= 0x3F800000;
		const float		posX	= (float)x / ((float)DE_LENGTH_OF_ARRAY(s_specialFloats) - 1.0f) * 2.0f - 1.0f; // map from [0, len(s_specialFloats) - 1] to [-1, 1]
		const float		posY	= (float)y / ((float)DE_LENGTH_OF_ARRAY(s_specialFloats) - 1.0f) * 2.0f - 1.0f;

		gridVertices[x * DE_LENGTH_OF_ARRAY(s_specialFloats) + y]	= tcu::Vec4(posX, posY, 0.0f, 1.0f);
		gridAttributes[x * DE_LENGTH_OF_ARRAY(s_specialFloats) + y]	= tcu::UVec4(s_specialFloats[x], s_specialFloats[y], one, one);
	}

	// tiles
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats) - 1; ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats) - 1; ++y)
	{
		const int baseNdx = (x * (DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) + y) * 6;

		indices[baseNdx + 0] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));
		indices[baseNdx + 1] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
		indices[baseNdx + 2] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));

		indices[baseNdx + 3] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));
		indices[baseNdx + 4] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
		indices[baseNdx + 5] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Drawing a grid with the shader. Setting a_attr for each vertex to (special, special, 1, 1)." << tcu::TestLog::EndMessage;

	// Draw grid
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				attribLoc	= gl.getAttribLocation(m_program->getProgram(), "a_attr");

		if (m_storage == STORAGE_BUFFER)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_positionVboID);
			gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(gridVertices.size() * sizeof(tcu::Vec4)), &gridVertices[0], GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttributeCase::iterate");

			gl.bindBuffer(GL_ARRAY_BUFFER, m_attribVboID);
			gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(gridAttributes.size() * sizeof(tcu::UVec4)), &gridAttributes[0], GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttributeCase::iterate");

			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_elementVboID);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(indices.size() * sizeof(deUint16)), &indices[0], GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttributeCase::iterate");
		}

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());

		if (m_storage == STORAGE_BUFFER)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_positionVboID);
			gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);

			gl.bindBuffer(GL_ARRAY_BUFFER, m_attribVboID);
			gl.vertexAttribPointer(attribLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);

			gl.enableVertexAttribArray(positionLoc);
			gl.enableVertexAttribArray(attribLoc);
			gl.drawElements(GL_TRIANGLES, (glw::GLsizei)(indices.size()), GL_UNSIGNED_SHORT, DE_NULL);
			gl.disableVertexAttribArray(positionLoc);
			gl.disableVertexAttribArray(attribLoc);

			gl.bindBuffer(GL_ARRAY_BUFFER, 0);
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		}
		else if (m_storage == STORAGE_CLIENT)
		{
			gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
			gl.vertexAttribPointer(attribLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridAttributes[0]);

			gl.enableVertexAttribArray(positionLoc);
			gl.enableVertexAttribArray(attribLoc);
			gl.drawElements(GL_TRIANGLES, (glw::GLsizei)(indices.size()), GL_UNSIGNED_SHORT, &indices[0]);
			gl.disableVertexAttribArray(positionLoc);
			gl.disableVertexAttribArray(attribLoc);
		}
		else
			DE_ASSERT(false);

		gl.useProgram(0);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttributeCase::iterate");

		glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
	}

	// verify everywhere was drawn (all pixels have Green = 255)
	if (!checkResultImage(resultImage))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing or invalid fragments");
		return STOP;
	}

	// test drawing still works
	if (!drawTestPattern(false))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "test pattern failed");
		return STOP;
	}

	// all ok
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}